

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_params.cpp
# Opt level: O0

void __thiscall
libtorrent::session_params::session_params
          (session_params *this,settings_pack *sp,
          vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
          *exts)

{
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  *exts_local;
  settings_pack *sp_local;
  session_params *this_local;
  
  settings_pack::settings_pack(&this->settings,sp);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::session_flags_tag,_void>::
  bitfield_flag(&this->flags);
  ::std::
  vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
  ::vector(&this->extensions,exts);
  libtorrent::dht::dht_state::dht_state(&this->dht_state);
  ::std::
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>
  ::
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(&)(libtorrent::settings_interface_const&),void>
            ((function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>
              *)&this->dht_storage_constructor,libtorrent::dht::dht_default_storage_constructor);
  ::std::
  function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
  ::function(&this->disk_io_constructor);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->ext_state);
  ip_filter::ip_filter(&this->ip_filter);
  libtorrent::dht::dht_settings::dht_settings(&this->dht_settings);
  return;
}

Assistant:

session_params::session_params(settings_pack const& sp // NOLINT
	, std::vector<std::shared_ptr<plugin>> exts)
	: settings(sp)
	, extensions(std::move(exts))
#ifndef TORRENT_DISABLE_DHT
	, dht_storage_constructor(dht::dht_default_storage_constructor)
#endif
	{}